

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O2

void __thiscall duckdb::Prefix::Append(Prefix *this,ART *art,Node other)

{
  Node *pNVar1;
  FixedSizeAllocator *this_00;
  idx_t i;
  ulong uVar2;
  Prefix prefix;
  Prefix local_60;
  Prefix other_prefix;
  
  prefix.in_memory = this->in_memory;
  prefix._17_7_ = *(undefined7 *)&this->field_0x11;
  prefix.data = this->data;
  prefix.ptr = this->ptr;
  while( true ) {
    if (((ulong)other.super_IndexPointer.data & 0x7f00000000000000) != 0x100000000000000) {
      return;
    }
    if ((long)other.super_IndexPointer.data < 0) break;
    Prefix(&other_prefix,art,other,true,false);
    for (uVar2 = 0; pNVar1 = prefix.ptr, uVar2 < other_prefix.data[art->prefix_count];
        uVar2 = uVar2 + 1) {
      Append(&local_60,&prefix,art,other_prefix.data[uVar2]);
      prefix.in_memory = local_60.in_memory;
      prefix.data = local_60.data;
      prefix.ptr = local_60.ptr;
    }
    ((prefix.ptr)->super_IndexPointer).data = ((other_prefix.ptr)->super_IndexPointer).data;
    this_00 = Node::GetAllocator(art,PREFIX);
    FixedSizeAllocator::Free(this_00,other.super_IndexPointer);
    other = (Node)(pNVar1->super_IndexPointer).data;
  }
  ((prefix.ptr)->super_IndexPointer).data = (idx_t)other.super_IndexPointer.data;
  return;
}

Assistant:

void Prefix::Append(ART &art, Node other) {
	D_ASSERT(other.HasMetadata());

	Prefix prefix = *this;
	while (other.GetType() == PREFIX) {
		if (other.GetGateStatus() == GateStatus::GATE_SET) {
			*prefix.ptr = other;
			return;
		}

		Prefix other_prefix(art, other, true);
		for (idx_t i = 0; i < other_prefix.data[Count(art)]; i++) {
			prefix = prefix.Append(art, other_prefix.data[i]);
		}

		*prefix.ptr = *other_prefix.ptr;
		Node::GetAllocator(art, PREFIX).Free(other);
		other = *prefix.ptr;
	}
}